

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O3

void __thiscall wallet::CWallet::blockConnected(CWallet *this,ChainstateRole role,BlockInfo *block)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock28;
  unique_lock<std::recursive_mutex> local_78;
  _Variadic_union<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
  local_68;
  undefined1 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (role != BACKGROUND) {
    if (*(long *)(block + 0x20) == 0) {
      __assert_fail("block.data",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
                    ,0x5e7,
                    "virtual void wallet::CWallet::blockConnected(ChainstateRole, const interfaces::BlockInfo &)"
                   );
    }
    local_78._M_device = &(this->cs_wallet).super_recursive_mutex;
    local_78._M_owns = false;
    std::unique_lock<std::recursive_mutex>::lock(&local_78);
    this->m_last_block_processed_height = *(int *)(block + 0x10);
    puVar1 = *(undefined8 **)block;
    uVar2 = *puVar1;
    uVar3 = puVar1[1];
    uVar4 = puVar1[3];
    *(undefined8 *)((this->m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 0x10) =
         puVar1[2];
    *(undefined8 *)((this->m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 0x18) =
         uVar4;
    *(undefined8 *)(this->m_last_block_processed).super_base_blob<256U>.m_data._M_elems = uVar2;
    *(undefined8 *)((this->m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 8) =
         uVar3;
    if (((this->m_birth_time).super___atomic_base<long>._M_i + -0x3840 <=
         (long)(ulong)*(uint *)(block + 0x30)) &&
       (lVar7 = *(long *)(*(long *)(block + 0x20) + 0x50),
       *(long *)(*(long *)(block + 0x20) + 0x58) != lVar7)) {
      lVar8 = 0;
      uVar6 = 0;
      do {
        puVar1 = *(undefined8 **)block;
        local_68._M_first._M_storage.confirmed_block_height = *(undefined4 *)(block + 0x10);
        local_68._0_8_ = *puVar1;
        local_68._8_8_ = puVar1[1];
        local_68._16_8_ = puVar1[2];
        local_68._24_8_ = puVar1[3];
        local_68._M_first._M_storage.position_in_block = (int)uVar6;
        local_40 = 0;
        bVar5 = AddToWalletIfInvolvingMe
                          (this,(CTransactionRef *)(lVar7 + lVar8),(SyncTxState *)&local_68._M_first
                           ,true,false);
        if (bVar5) {
          MarkInputsDirty(this,(CTransactionRef *)(lVar7 + lVar8));
        }
        transactionRemovedFromMempool
                  (this,(CTransactionRef *)(*(long *)(*(long *)(block + 0x20) + 0x50) + lVar8),BLOCK
                  );
        uVar6 = uVar6 + 1;
        lVar7 = *(long *)(*(long *)(block + 0x20) + 0x50);
        lVar8 = lVar8 + 0x10;
      } while (uVar6 < (ulong)(*(long *)(*(long *)(block + 0x20) + 0x58) - lVar7 >> 4));
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_78);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CWallet::blockConnected(ChainstateRole role, const interfaces::BlockInfo& block)
{
    if (role == ChainstateRole::BACKGROUND) {
        return;
    }
    assert(block.data);
    LOCK(cs_wallet);

    m_last_block_processed_height = block.height;
    m_last_block_processed = block.hash;

    // No need to scan block if it was created before the wallet birthday.
    // Uses chain max time and twice the grace period to adjust time for block time variability.
    if (block.chain_time_max < m_birth_time.load() - (TIMESTAMP_WINDOW * 2)) return;

    // Scan block
    for (size_t index = 0; index < block.data->vtx.size(); index++) {
        SyncTransaction(block.data->vtx[index], TxStateConfirmed{block.hash, block.height, static_cast<int>(index)});
        transactionRemovedFromMempool(block.data->vtx[index], MemPoolRemovalReason::BLOCK);
    }
}